

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalOr(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  runtime_error *prVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Parser *in_RSI;
  Expression *__tmp;
  shared_ptr<minja::Expression> sVar6;
  shared_ptr<minja::Expression> right;
  Location location;
  undefined1 local_68 [32];
  Location local_48;
  
  parseLogicalAnd(this);
  if ((this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected left side of \'logical or\' expression");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseLogicalOr()::or_tok_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseLogicalOr()::or_tok_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseLogicalOr()::or_tok_abi_cxx11_,"or\\b",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseLogicalOr()::or_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseLogicalOr()::or_tok_abi_cxx11_);
    }
  }
  local_48.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (in_RSI->template_str).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_48.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (in_RSI->template_str).
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_48.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.source.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_48.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.source.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_48.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.pos = (long)(in_RSI->it)._M_current - (long)(in_RSI->start)._M_current;
  while( true ) {
    consumeToken((string *)local_68,in_RSI,&parseLogicalOr()::or_tok_abi_cxx11_,Strip);
    uVar1 = local_68._8_8_;
    _Var5._M_pi = extraout_RDX;
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      _Var5._M_pi = extraout_RDX_00;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    parseLogicalAnd((Parser *)local_68);
    if ((pointer)local_68._0_8_ == (pointer)0x0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Expected right side of \'or\' expression");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261f10;
    BinaryOpExpr::BinaryOpExpr
              ((BinaryOpExpr *)(p_Var3 + 1),&local_48,(shared_ptr<minja::Expression> *)this,
               (shared_ptr<minja::Expression> *)local_68,Or);
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var3 + 1);
    this_00 = (this->template_str).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  if (local_48.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.source.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var5._M_pi = extraout_RDX_01;
  }
  sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseLogicalOr() {
        auto left = parseLogicalAnd();
        if (!left) throw std::runtime_error("Expected left side of 'logical or' expression");

        static std::regex or_tok(R"(or\b)");
        auto location = get_location();
        while (!consumeToken(or_tok).empty()) {
            auto right = parseLogicalAnd();
            if (!right) throw std::runtime_error("Expected right side of 'or' expression");
            left = std::make_shared<BinaryOpExpr>(location, std::move(left), std::move(right), BinaryOpExpr::Op::Or);
        }
        return left;
    }